

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::GetFortranModuleDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  string local_38 [32];
  cmCommonTargetGenerator *local_18;
  cmCommonTargetGenerator *this_local;
  
  local_18 = this;
  this_local = (cmCommonTargetGenerator *)__return_storage_ptr__;
  if ((this->FortranModuleDirectoryComputed & 1U) == 0) {
    this->FortranModuleDirectoryComputed = true;
    (*this->_vptr_cmCommonTargetGenerator[2])(local_38);
    std::__cxx11::string::operator=((string *)&this->FortranModuleDirectory,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->FortranModuleDirectory);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetFortranModuleDirectory()
{
  // Compute the module directory.
  if(!this->FortranModuleDirectoryComputed)
    {
    this->FortranModuleDirectoryComputed = true;
    this->FortranModuleDirectory = this->ComputeFortranModuleDirectory();
    }

  // Return the computed directory.
  return this->FortranModuleDirectory;
}